

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int falsecolor(int argc,char **argv)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  Allocator AVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  long lVar7;
  int iVar8;
  char *msg;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  Float FVar12;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar13;
  float fVar14;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [60];
  undefined1 auVar15 [64];
  Float FVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 in_XMM4 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  bool plusMinus;
  allocator<char> local_567;
  allocator<char> local_566;
  allocator<char> local_565;
  Float maxValue;
  char **argv_local;
  undefined1 local_558 [16];
  Float local_548;
  undefined4 uStack_544;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  long local_530;
  WrapMode2D local_528;
  WrapMode2D local_520;
  _Any_data local_518;
  code *local_508;
  code *local_500;
  string inFile;
  string outFile;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  ColorEncodingHandle local_478;
  ColorEncodingHandle local_470;
  aligned_storage_t<sizeof(float),_alignof(float)> local_468;
  float fStack_464;
  float afStack_460 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_458;
  string asStack_448 [32];
  string local_428 [8];
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_3d8;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  optional<int> oStack_3b8;
  optional<float> oStack_3b0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_3a8;
  undefined8 uStack_3a0;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_398;
  Image outImage;
  ImageAndMetadata im;
  
  outFile._M_dataplus._M_p = (pointer)&outFile.field_2;
  inFile._M_dataplus._M_p = (pointer)&inFile.field_2;
  outFile._M_string_length = 0;
  inFile._M_string_length = 0;
  outFile.field_2._M_local_buf[0] = '\0';
  inFile.field_2._M_local_buf[0] = '\0';
  plusMinus = false;
  maxValue = -INFINITY;
  argv_local = argv;
LAB_0025e7de:
  do {
    if (*argv_local == (char *)0x0) {
      if (inFile._M_string_length == 0) {
        msg = "expecting input image filename.";
      }
      else {
        if (outFile._M_string_length != 0) {
          AVar5.memoryResource = pstd::pmr::new_delete_resource();
          local_470.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          pbrt::Image::Read(&im,&inFile,AVar5,&local_470);
          TVar6 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
          if (maxValue <= -INFINITY) {
            lVar9 = 0;
            lVar10 = 0;
            while( true ) {
              local_558._0_8_ = lVar10;
              if ((long)TVar6 >> 0x20 <= lVar10) break;
              for (lVar10 = 0; lVar10 < TVar6.x; lVar10 = lVar10 + 1) {
                pbrt::WrapMode2D::WrapMode2D(&local_520,Clamp);
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)&outImage,&im.image,(Point2i)(lVar9 + lVar10),
                           local_520);
                auVar15._0_4_ = pbrt::ImageChannelValues::Average((ImageChannelValues *)&outImage);
                auVar15._4_60_ = extraout_var_00;
                auVar11._8_4_ = 0x7fffffff;
                auVar11._0_8_ = 0x7fffffff7fffffff;
                auVar11._12_4_ = 0x7fffffff;
                auVar11 = vandps_avx512vl(auVar15._0_16_,auVar11);
                auVar11 = vmaxss_avx(auVar11,ZEXT416((uint)maxValue));
                maxValue = auVar11._0_4_;
                pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                               &outImage);
                TVar6 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
              }
              lVar9 = lVar9 + 0x100000000;
              lVar10 = local_558._0_8_ + 1;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"R",&local_565);
          std::__cxx11::string::string<std::allocator<char>>(asStack_448,"G",&local_566);
          std::__cxx11::string::string<std::allocator<char>>(local_428,"B",&local_567);
          local_478.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          AVar5.memoryResource = pstd::pmr::new_delete_resource();
          channels.n = 3;
          channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_468;
          pbrt::Image::Image(&outImage,Half,(Point2i)TVar6,channels,&local_478,AVar5);
          lVar10 = 0x40;
          do {
            std::__cxx11::string::~string((string *)((long)&local_468 + lVar10));
            lVar10 = lVar10 + -0x20;
          } while (lVar10 != -0x20);
          lVar10 = 0;
          local_530 = 0;
          TVar6 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
          do {
            if ((long)TVar6 >> 0x20 <= local_530) {
              _Stack_398.super__Rb_tree_header._M_header._M_left =
                   &_Stack_398.super__Rb_tree_header._M_header;
              aStack_3a8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                            )0x0;
              uStack_3a0._0_1_ = false;
              uStack_3a0._1_7_ = 0;
              _Stack_398._0_8_ = 0;
              _Stack_398.super__Rb_tree_header._M_header._M_color = _S_red;
              _Stack_398.super__Rb_tree_header._M_header._4_4_ = 0;
              _Stack_398.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              uStack_3e8 = 0;
              uStack_3e0 = 0;
              aStack_3d8._0_8_ = 0;
              aStack_3d8._8_8_ = 0;
              uStack_3c8 = 0;
              local_3c0 = 0;
              oStack_3b8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
              oStack_3b8.set = false;
              oStack_3b8._5_3_ = 0;
              oStack_3b0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
              oStack_3b0.set = false;
              oStack_3b0._5_3_ = 0;
              local_428[0] = (string)0x0;
              local_428[1] = (string)0x0;
              local_428[2] = (string)0x0;
              local_428[3] = (string)0x0;
              local_428[4] = (string)0x0;
              local_428[5] = (string)0x0;
              local_428[6] = (string)0x0;
              local_428[7] = (string)0x0;
              uStack_420 = 0;
              uStack_418 = 0;
              uStack_410 = 0;
              uStack_408 = 0;
              uStack_400 = 0;
              uStack_3f8 = 0;
              uStack_3f0 = 0;
              local_468 = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
              fStack_464._0_1_ = false;
              fStack_464._1_3_ = 0;
              afStack_460 = (float  [2])0x0;
              aStack_458._M_allocated_capacity = 0;
              aStack_458._8_8_ = 0;
              asStack_448[0] = (string)0x0;
              asStack_448[1] = (string)0x0;
              asStack_448[2] = (string)0x0;
              asStack_448[3] = (string)0x0;
              asStack_448[4] = (string)0x0;
              asStack_448[5] = (string)0x0;
              asStack_448[6] = (string)0x0;
              asStack_448[7] = (string)0x0;
              asStack_448[8] = (string)0x0;
              asStack_448[9] = (string)0x0;
              asStack_448[10] = (string)0x0;
              asStack_448[0xb] = (string)0x0;
              asStack_448[0xc] = (string)0x0;
              asStack_448[0xd] = (string)0x0;
              asStack_448[0xe] = (string)0x0;
              asStack_448[0xf] = (string)0x0;
              asStack_448[0x10] = (string)0x0;
              asStack_448[0x11] = (string)0x0;
              asStack_448[0x12] = (string)0x0;
              asStack_448[0x13] = (string)0x0;
              asStack_448[0x14] = (string)0x0;
              asStack_448[0x15] = (string)0x0;
              asStack_448[0x16] = (string)0x0;
              asStack_448[0x17] = (string)0x0;
              asStack_448[0x18] = (string)0x0;
              asStack_448[0x19] = (string)0x0;
              asStack_448[0x1a] = (string)0x0;
              asStack_448[0x1b] = (string)0x0;
              asStack_448[0x1c] = (string)0x0;
              asStack_448[0x1d] = (string)0x0;
              asStack_448[0x1e] = (string)0x0;
              asStack_448[0x1f] = (string)0x0;
              _Stack_398.super__Rb_tree_header._M_node_count = 0;
              _Stack_398.super__Rb_tree_header._M_header._M_right =
                   _Stack_398.super__Rb_tree_header._M_header._M_left;
              bVar3 = pbrt::Image::Write(&outImage,&outFile,(ImageMetadata *)&local_468);
              pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&local_468);
              pbrt::Image::~Image(&outImage);
              pbrt::ImageAndMetadata::~ImageAndMetadata(&im);
              std::__cxx11::string::~string((string *)&inFile);
              std::__cxx11::string::~string((string *)&outFile);
              return (uint)!bVar3;
            }
            for (lVar9 = 0; lVar9 < TVar6.x; lVar9 = lVar9 + 1) {
              pbrt::WrapMode2D::WrapMode2D(&local_528,Clamp);
              pbrt::Image::GetChannels
                        ((ImageChannelValues *)&local_468,&im.image,(Point2i)(lVar10 + lVar9),
                         local_528);
              FVar12 = pbrt::ImageChannelValues::Average((ImageChannelValues *)&local_468);
              local_558._0_4_ = FVar12 / maxValue;
              local_558._4_12_ = extraout_var;
              pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
              ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                             &local_468);
              if (plusMinus == true) {
                auVar15 = ZEXT1664(local_558);
                if (local_558._0_4_ <= 0.0) {
                  auVar2._8_4_ = 0x7fffffff;
                  auVar2._0_8_ = 0x7fffffff7fffffff;
                  auVar2._12_4_ = 0x7fffffff;
                  auVar11 = vandps_avx512vl(local_558,auVar2);
                  FVar12 = auVar11._0_4_;
                  auVar15 = ZEXT864(0) << 0x20;
                  FVar16 = 0.0;
                  goto LAB_0025ec6a;
                }
                FVar16 = 0.0;
                FVar12 = 0.0;
LAB_0025ecaf:
                fVar14 = auVar15._0_4_;
                aVar13 = (aligned_storage_t<sizeof(float),_alignof(float)>)(FVar12 * 0.07739938);
                uVar17 = 0;
                uVar18 = 0;
                uVar19 = 0;
              }
              else {
                auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_558);
                uVar1 = vcmpss_avx512f(local_558,ZEXT816(0) << 0x40,1);
                lVar7 = ((long)falseColorValues.
                               super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)falseColorValues.
                              super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0xc;
                auVar2 = vcvtusi2ss_avx512f(in_XMM4,lVar7);
                iVar4 = (int)lVar7 + -1;
                iVar8 = (int)((float)((uint)!(bool)((byte)uVar1 & 1) * auVar11._0_4_) * auVar2._0_4_
                             );
                if (iVar8 <= iVar4) {
                  iVar4 = iVar8;
                }
                FVar12 = falseColorValues.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar4].r;
                auVar15 = ZEXT464((uint)falseColorValues.
                                        super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                                        _M_impl.super__Vector_impl_data._M_start[iVar4].g);
                FVar16 = falseColorValues.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar4].b;
LAB_0025ec6a:
                if (FVar12 <= 0.04045) goto LAB_0025ecaf;
                local_558 = auVar15._0_16_;
                uStack_544 = 0;
                uStack_540 = 0;
                uStack_53c = 0;
                local_548 = FVar16;
                aVar13 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                         powf((FVar12 + 0.055) * 0.94786733,2.4);
                fVar14 = local_558._0_4_;
                FVar16 = local_548;
                uVar17 = uStack_544;
                uVar18 = uStack_540;
                uVar19 = uStack_53c;
              }
              local_468 = aVar13;
              if (fVar14 <= 0.04045) {
                fVar14 = fVar14 * 0.07739938;
              }
              else {
                local_548 = FVar16;
                uStack_544 = uVar17;
                uStack_540 = uVar18;
                uStack_53c = uVar19;
                fVar14 = powf((fVar14 + 0.055) * 0.94786733,2.4);
                FVar16 = local_548;
              }
              fStack_464 = fVar14;
              if (FVar16 <= 0.04045) {
                fVar14 = FVar16 * 0.07739938;
              }
              else {
                fVar14 = powf((FVar16 + 0.055) * 0.94786733,2.4);
              }
              afStack_460[0] = fVar14;
              values.n = 3;
              values.ptr = (float *)&local_468;
              pbrt::Image::SetChannels(&outImage,(Point2i)(lVar10 + lVar9),values);
              TVar6 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
            }
            lVar10 = lVar10 + 0x100000000;
            local_530 = local_530 + 1;
          } while( true );
        }
        msg = "expecting --outfile filename.";
      }
      usage("falsecolor",msg);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&im,"outfile",&local_565);
    local_498._M_unused._M_object = (void *)0x0;
    local_498._8_8_ = 0;
    local_480 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                ::_M_invoke;
    local_488 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                ::_M_manager;
    bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&im,&outFile,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_498);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&outImage,"plusminus",&local_566)
      ;
      local_518._M_unused._M_object = (void *)0x0;
      local_518._8_8_ = 0;
      local_500 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                  ::_M_invoke;
      local_508 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                  ::_M_manager;
      bVar3 = pbrt::ParseArg<bool*>
                        (&argv_local,(string *)&outImage,&plusMinus,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_518);
      if (!bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,"maxValue",&local_567);
        local_4b8._M_unused._M_object = (void *)0x0;
        local_4b8._8_8_ = 0;
        local_4a0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                    ::_M_invoke;
        local_4a8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                    ::_M_manager;
        bVar3 = pbrt::ParseArg<float*>
                          (&argv_local,(string *)&local_468,&maxValue,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_4b8);
        std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
        std::__cxx11::string::~string((string *)&local_468);
        std::_Function_base::~_Function_base((_Function_base *)&local_518);
        std::__cxx11::string::~string((string *)&outImage);
        std::_Function_base::~_Function_base((_Function_base *)&local_498);
        std::__cxx11::string::~string((string *)&im);
        if (!bVar3) {
          if ((inFile._M_string_length != 0) || (**argv_local == '-')) {
            usage("falsecolor","%s: unknown command flag");
          }
          std::__cxx11::string::assign((char *)&inFile);
          argv_local = argv_local + 1;
        }
        goto LAB_0025e7de;
      }
      std::_Function_base::~_Function_base((_Function_base *)&local_518);
      std::__cxx11::string::~string((string *)&outImage);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_498);
    std::__cxx11::string::~string((string *)&im);
  } while( true );
}

Assistant:

int falsecolor(int argc, char *argv[]) {
    std::string outFile, inFile;
    bool plusMinus = false;
    Float maxValue = -Infinity;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("falsecolor", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "plusminus", &plusMinus, onError) ||
            ParseArg(&argv, "maxValue", &maxValue, onError)) {
            // success
        } else if (inFile.empty() && argv[0][0] != '-') {
            inFile = *argv;
            ++argv;
        } else {
            usage("falsecolor", "%s: unknown command flag", *argv);
        }
    }

    if (inFile.empty())
        usage("falsecolor", "expecting input image filename.");
    if (outFile.empty())
        usage("falsecolor", "expecting --outfile filename.");

    ImageAndMetadata im = Image::Read(inFile);
    const Image &image = im.image;

    if (maxValue == -Infinity)
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                maxValue =
                    std::max(maxValue, std::abs(image.GetChannels({x, y}).Average()));

    Image outImage(PixelFormat::Half, image.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x) {
            Float relativeValue = image.GetChannels({x, y}).Average() / maxValue;
            RGB rgb;
            if (plusMinus) {
                if (relativeValue > 0)
                    rgb = RGB(0, relativeValue, 0);
                else
                    rgb = RGB(std::abs(relativeValue), 0, 0);
            } else {
                relativeValue = Clamp(relativeValue, 0, 1);
                int index = relativeValue * falseColorValues.size();
                index = std::min<int>(index, falseColorValues.size() - 1);
                rgb = falseColorValues[index];
            }

            outImage.SetChannels({x, y}, {SRGBToLinear(rgb[0]), SRGBToLinear(rgb[1]),
                                          SRGBToLinear(rgb[2])});
        }

    if (!outImage.Write(outFile))
        return 1;

    return 0;
}